

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *ppuVar1;
  int iVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  size_type sVar7;
  ssize_t sVar8;
  float *goal_position;
  void *__buf;
  float *j_max_limits_00;
  float fVar9;
  value_type_conflict1 local_2c7;
  value_type_conflict1 local_2c6;
  value_type_conflict1 local_2c5;
  int local_2c4;
  undefined1 local_2c0 [4];
  int j;
  vector<float,_std::allocator<float>_> p1_1;
  float next_waypoint [3];
  float time_step;
  float t_1;
  float t_prev;
  int i;
  vector<float,_std::allocator<float>_> p1;
  float joint_angle_increment [3];
  float start_waypoint [3];
  float current [3];
  Connection s1;
  undefined1 local_208 [8];
  Robot R1;
  Scalar local_180;
  Scalar local_178;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_128;
  int local_108 [2];
  undefined1 local_100 [8];
  MatrixXd m1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_d8;
  float local_bc;
  char acStack_b8 [4];
  float t;
  char input_file [60];
  float j_max_limits [3];
  float j_min_limits [3];
  bool is_running;
  vector<unsigned_char,_std::allocator<unsigned_char>_> current_position;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commanded_position;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  Waypoints;
  
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(j_min_limits + 2));
  j_min_limits[1]._3_1_ = 1;
  stack0xffffffffffffff98 = 0xbfc90fdbc0490fdb;
  j_min_limits[0] = -3.1415927;
  stack0xffffffffffffff88 = 0x3fc90fdb40490fdb;
  j_max_limits[0] = 3.1415927;
  input_file[0x28] = 'x';
  input_file[0x29] = 't';
  input_file[0x2a] = '\0';
  input_file[0x2b] = '\0';
  input_file[0x2c] = '\0';
  input_file[0x2d] = '\0';
  input_file[0x2e] = '\0';
  input_file[0x2f] = '\0';
  input_file[0x30] = '\0';
  input_file[0x31] = '\0';
  input_file[0x32] = '\0';
  input_file[0x33] = '\0';
  input_file[0x18] = 't';
  input_file[0x19] = 'r';
  input_file[0x1a] = 'a';
  input_file[0x1b] = 'c';
  input_file[0x1c] = 'k';
  input_file[0x1d] = 'i';
  input_file[0x1e] = 'n';
  input_file[0x1f] = 'g';
  input_file[0x20] = '/';
  input_file[0x21] = 'i';
  input_file[0x22] = 'n';
  input_file[0x23] = 'p';
  input_file[0x24] = 'u';
  input_file[0x25] = 't';
  input_file[0x26] = '.';
  input_file[0x27] = 't';
  input_file[8] = 't';
  input_file[9] = '_';
  input_file[10] = 'I';
  input_file[0xb] = 'k';
  input_file[0xc] = '_';
  input_file[0xd] = 't';
  input_file[0xe] = 'r';
  input_file[0xf] = 'a';
  input_file[0x10] = 'j';
  input_file[0x11] = 'e';
  input_file[0x12] = 'c';
  input_file[0x13] = 't';
  input_file[0x14] = 'o';
  input_file[0x15] = 'r';
  input_file[0x16] = 'y';
  input_file[0x17] = '_';
  builtin_strncpy(acStack_b8,"/hom",4);
  t._0_1_ = 'e';
  t._1_1_ = '/';
  t._2_1_ = 'g';
  t._3_1_ = 'o';
  input_file[0] = 'k';
  input_file[1] = 'u';
  input_file[2] = 'l';
  input_file[3] = '/';
  input_file[4] = 'R';
  input_file[5] = 'o';
  input_file[6] = 'b';
  input_file[7] = 'o';
  local_bc = 0.0;
  trajectory_waypoints(&local_d8,acStack_b8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&commanded_position.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_d8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_d8);
  local_108[1] = 3;
  local_108[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_100,local_108 + 1,local_108);
  local_130 = 1.5707963267948966;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_128,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_100,&local_130
            );
  local_138 = 10.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_128,&local_138);
  local_140 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_140);
  local_148 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_148);
  local_150 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_150);
  local_158 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_158);
  local_160 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_160);
  local_168 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_168);
  local_170 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_170);
  local_178 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_178);
  local_180 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_180);
  R1.singularity_pt = false;
  R1._121_7_ = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar3,(Scalar *)&R1.singularity_pt);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_128);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)&s1.data_size,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_100);
  j_max_limits_00 = (float *)(input_file + 0x38);
  Robot::Robot((Robot *)local_208,3,(MatrixXd *)&s1.data_size,j_max_limits + 2,j_max_limits_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)&s1.data_size);
  Connection::Connection((Connection *)(current + 2),3);
  current[0] = 0.0;
  start_waypoint[1] = 0.0;
  start_waypoint[2] = 0.0;
  ppuVar1 = &commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar4 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)ppuVar1,0);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,0);
  joint_angle_increment[1] = *pvVar5;
  pvVar4 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)ppuVar1,0);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,1);
  joint_angle_increment[2] = *pvVar5;
  pvVar4 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)ppuVar1,0);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,2);
  start_waypoint[0] = *pvVar5;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,joint_angle_increment[1]);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,joint_angle_increment[2]);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,start_waypoint[0]);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  joint_angle_increment[0] = 0.0;
  p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Robot::closest_IK_solutions
            ((vector<float,_std::allocator<float>_> *)&t_prev,(Robot *)local_208,start_waypoint + 1,
             joint_angle_increment + 1);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&t_prev,0);
  start_waypoint[1] = *pvVar5;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&t_prev,1);
  start_waypoint[2] = *pvVar5;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&t_prev,2);
  current[0] = *pvVar5;
  t_1 = 1.4013e-45;
  do {
    sVar7 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&commanded_position.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    fVar9 = local_bc;
    if (sVar7 <= (ulong)(long)(int)t_1) {
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&t_prev);
      Connection::~Connection((Connection *)(current + 2));
      Robot::~Robot((Robot *)local_208);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_100);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(j_min_limits + 2));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)&commanded_position.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      return 0;
    }
    ppuVar1 = &commanded_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)ppuVar1,(long)(int)t_1);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,3);
    fVar9 = (*pvVar5 - fVar9) * 50.0;
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)ppuVar1,(long)(int)t_1);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,0);
    p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *pvVar5;
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)ppuVar1,(long)(int)t_1);
    std::vector<float,_std::allocator<float>_>::operator[](pvVar4,1);
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)ppuVar1,(long)(int)t_1);
    std::vector<float,_std::allocator<float>_>::operator[](pvVar4,2);
    goal_position =
         (float *)((long)&p1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4);
    Robot::closest_IK_solutions
              ((vector<float,_std::allocator<float>_> *)local_2c0,(Robot *)local_208,
               start_waypoint + 1,goal_position);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2c0,0);
    p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT44(p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,
                           (*pvVar5 - start_waypoint[1]) / fVar9);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2c0,1);
    p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT44((*pvVar5 - start_waypoint[2]) / fVar9,
                           p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._0_4_);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_2c0,2);
    joint_angle_increment[0] = (*pvVar5 - current[0]) / fVar9;
    for (local_2c4 = 0; (float)local_2c4 < fVar9; local_2c4 = local_2c4 + 1) {
      iVar2 = Connection::receive((Connection *)(current + 2),
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (j_min_limits + 2));
      if (iVar2 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Unable to read the current position");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        break;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"Current position received successfully");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      start_waypoint[1] =
           start_waypoint[1] +
           p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_4_;
      start_waypoint[2] =
           start_waypoint[2] +
           p1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
      current[0] = current[0] + joint_angle_increment[0];
      local_2c5 = (value_type_conflict1)(int)start_waypoint[1];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c5);
      local_2c6 = (value_type_conflict1)(int)start_waypoint[2];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c6);
      local_2c7 = (value_type_conflict1)(int)current[0];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &current_position.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c7);
      poVar6 = std::operator<<((ostream *)&std::cout,"Waypoint ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)t_1);
      poVar6 = std::operator<<(poVar6,":Joint_angles");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,start_waypoint[1]);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,start_waypoint[2]);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,current[0]);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      sVar8 = Connection::send((Connection *)(current + 2),(int)&current_position + 0x10,__buf,
                               (size_t)goal_position,(int)j_max_limits_00);
      if ((int)sVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Socket communication failure");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"Commanded successfully");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_2c0);
    t_1 = (float)((int)t_1 + 1);
  } while( true );
}

Assistant:

int main() {
    // Vector for extracting the waypoints
    std::vector<std::vector<float> > Waypoints;
    std::vector<unsigned char > commanded_position;
    std::vector<unsigned char > current_position;

    bool is_running = true;

    //Assign the joint limits
    float j_min_limits[3] = {-M_PI, -M_PI / 2, -M_PI};
    float j_max_limits[3] = {M_PI, M_PI / 2, M_PI};

    //Location of the file which has the trajectory
    char input_file[60] = "/home/gokul/Robot_Ik_trajectory_tracking/input.txt";
    float t = 0;
    Waypoints = trajectory_waypoints(input_file);

    //Create an Eigen matrix to store the DH parameters
    Eigen::MatrixXd m1(3, 4);
    m1 << M_PI / 2, 10, 0, 0, 0, 5, 0, 0, 0, 5, 0, 0;

    //Initialize the robot with DH param and joint limits
    Robot R1(3, m1, j_min_limits, j_max_limits);

    //Create a connection with packet data size 3(three angles)
    Connection s1(3);

    //Command the robot to the start point of the trajectory
    float current[] = {0, 0, 0};

    //Extract the start point of trajectory
    float start_waypoint[] = {Waypoints[0][0], Waypoints[0][1], Waypoints[0][2]};
    std::cout<<start_waypoint[0]<<std::endl;
    std::cout<<start_waypoint[1]<<std::endl;
    std::cout<<start_waypoint[2]<<std::endl;

    //Initialize joint angle increment
    float joint_angle_increment[] = {0, 0, 0};

    //Find the joint angles for the start position
    std::vector<float> p1 = R1.closest_IK_solutions(current,start_waypoint) ;

    //Assign the start position
    current[0]=p1[0];
    current[1]=p1[1];
    current[2]=p1[2];

    //Joint space trajectory control
    //Follow the trajectory
    for (int i = 1; i < Waypoints.size(); i++) {
        float t_prev = t;
        float t = Waypoints[i][3];
        float time_step = (t - t_prev) * 50;
        float next_waypoint[] = {Waypoints[i][0], Waypoints[i][1], Waypoints[i][2]};

        //Extract the joint angles of the waypoints
        std::vector<float> p1 = R1.closest_IK_solutions(current, next_waypoint);

        //Find the joint angle increment based on the time between 2 waypoints
        //Assuming that the robot is always able to go to the commanded position in the specific time
        joint_angle_increment[0] = (p1[0] - current[0]) / time_step;
        joint_angle_increment[1] = (p1[1] - current[1]) / time_step;
        joint_angle_increment[2] = (p1[2] - current[2]) / time_step;

        for(int j=0;j<time_step;j++) {

            // Receive the current position from the robot
            if(s1.receive(current_position))
                std::cout<<"Current position received successfully"<<std::endl;
            else
            {
                std::cout<<"Unable to read the current position"<<std::endl;
                break;
            }

            //Increment the current position
            current[0] = current[0] + joint_angle_increment[0];
            current[1] = current[1] + joint_angle_increment[1];
            current[2] = current[2] + joint_angle_increment[2];

            commanded_position.push_back(current[0]);
            commanded_position.push_back(current[1]);
            commanded_position.push_back(current[2]);

            std::cout << "Waypoint " << i << ":Joint_angles" << std::endl;
            std::cout << current[0] << std::endl;
            std::cout << current[1] << std::endl;
            std::cout << current[2] << std::endl;

            //Send the calculated joint angle through the socket
            if(s1.send(commanded_position))
            {
                cout<<"Commanded successfully"<<std::endl;
            } else
            {
                cout<<"Socket communication failure"<<std::endl;
            }

        }
    }

    return 0;

}